

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void __thiscall tk::_data::_data(_data *this,uint32_t sz)

{
  char *pcVar1;
  uint32_t sz_local;
  _data *this_local;
  
  pcVar1 = (char *)malloc((ulong)sz);
  this->data = pcVar1;
  if (this->data == (char *)0x0) {
    this->size = 0;
    this->owned = false;
  }
  else {
    this->size = sz;
    this->owned = true;
  }
  return;
}

Assistant:

_data::_data(uint32_t sz){
        this->data = (char*)malloc(sz);
        if(!this->data){
            this->size = 0;
            this->owned = false;
        }else{
            this->size = sz;
            this->owned = true;
        }
    }